

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::splitsliver(tetgenmesh *this,triface *slitet,double cosd,int chkencflag)

{
  tetrahedron *pppdVar1;
  uint *puVar2;
  undefined8 uVar3;
  arraypool *paVar4;
  memorypool *pmVar5;
  tetgenmesh *ptVar6;
  int iVar7;
  long *plVar8;
  char *pcVar9;
  tetrahedron *pppdVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  tetrahedron *pppdVar17;
  ulong uVar18;
  point steinerpt;
  optparameters opm;
  double smtpt [3];
  insertvertexflags ivf;
  triface local_140;
  long *local_130;
  ulong local_128;
  int local_120;
  uint local_11c;
  tetgenmesh *local_118;
  point local_110;
  optparameters local_108;
  double local_d0;
  double local_c8 [4];
  insertvertexflags local_a8;
  
  local_108.max_min_volume = 0;
  local_108.min_max_aspectratio = 0;
  local_108.min_max_dihedangle = 0;
  local_108.initval = 0.0;
  local_108.imprval = 0.0;
  local_108.numofsearchdirs = 10;
  local_108.searchstep = 0.01;
  local_108.maxiter = -1;
  local_108.smthiter = 0;
  local_a8.refinetet.tet = (tetrahedron *)0x0;
  local_a8.refinetet.ver = 0;
  local_a8.refinesh.sh = (shellface *)0x0;
  local_a8.refinesh.shver = 0;
  local_a8.smlenflag = 0;
  local_a8.smlen = 0.0;
  local_a8.iloc = 0;
  local_a8.bowywat = 0;
  local_a8.lawson = 0;
  local_a8.splitbdflag = 0;
  local_a8.validflag = 0;
  local_a8.respectbdflag = 0;
  local_a8.rejflag = 0;
  local_a8.chkencflag = 0;
  local_a8.cdtflag = 0;
  local_a8.assignmeshsize = 0;
  local_a8.sloc = 0;
  local_a8.sbowywat = 0;
  local_a8.refineflag = 0;
  pppdVar17 = slitet->tet;
  iVar7 = edestoppotbl[slitet->ver];
  if ((pppdVar17[8] == (tetrahedron)0x0) || (pppdVar17[8][ver2edge[iVar7]] == (double *)0x0)) {
    uVar14 = 0;
    pppdVar10 = pppdVar17;
    iVar15 = iVar7;
    do {
      if (pppdVar10[7] == (tetrahedron)this->dummypoint) break;
      uVar14 = uVar14 + 1;
      pppdVar1 = pppdVar10 + facepivot1[iVar15];
      pppdVar10 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      iVar15 = facepivot2[iVar15][(uint)*pppdVar1 & 0xf];
    } while (pppdVar17 != pppdVar10);
    if (pppdVar10[7] != (tetrahedron)this->dummypoint) {
      local_128 = (long)(int)uVar14 << 4;
      local_140.tet = pppdVar17;
      local_140.ver = iVar7;
      local_120 = chkencflag;
      local_118 = this;
      local_d0 = cosd;
      plVar8 = (long *)operator_new__(local_128);
      ptVar6 = local_118;
      if (uVar14 != 0) {
        plVar11 = plVar8;
        do {
          *plVar11 = 0;
          *(undefined4 *)(plVar11 + 1) = 0;
          plVar11 = plVar11 + 2;
        } while (plVar11 != (long *)((long)plVar8 + local_128));
      }
      if (0 < (int)uVar14) {
        lVar12 = 0;
        do {
          *(tetrahedron **)((long)plVar8 + lVar12) = pppdVar17;
          *(int *)((long)plVar8 + lVar12 + 8) = iVar7;
          pppdVar10 = pppdVar17 + facepivot1[iVar7];
          pppdVar17 = (tetrahedron *)((ulong)*pppdVar10 & 0xfffffffffffffff0);
          iVar7 = facepivot2[iVar7][(uint)*pppdVar10 & 0xf];
          lVar12 = lVar12 + 0x10;
        } while ((ulong)uVar14 << 4 != lVar12);
      }
      pppdVar17 = local_140.tet;
      iVar7 = local_140.ver;
      local_130 = plVar8;
      local_11c = uVar14;
      if (0 < (int)uVar14) {
        local_128 = (ulong)uVar14 << 4;
        uVar18 = 0;
        do {
          uVar3 = *(undefined8 *)((long)plVar8 + uVar18);
          iVar7 = esymtbl[eprevtbl[*(int *)((long)plVar8 + uVar18 + 8)]];
          paVar4 = ptVar6->cavetetlist;
          pcVar9 = arraypool::getblock(paVar4,(int)paVar4->objects);
          lVar12 = (long)paVar4->objectbytes *
                   ((long)paVar4->objectsperblock - 1U & paVar4->objects);
          paVar4->objects = paVar4->objects + 1;
          *(undefined8 *)(pcVar9 + lVar12) = uVar3;
          *(int *)(pcVar9 + lVar12 + 8) = iVar7;
          pppdVar17 = *(tetrahedron **)((long)plVar8 + uVar18);
          iVar7 = esymtbl[enexttbl[*(int *)((long)plVar8 + uVar18 + 8)]];
          paVar4 = ptVar6->cavetetlist;
          pcVar9 = arraypool::getblock(paVar4,(int)paVar4->objects);
          lVar12 = (long)paVar4->objectbytes *
                   ((long)paVar4->objectsperblock - 1U & paVar4->objects);
          paVar4->objects = paVar4->objects + 1;
          *(tetrahedron **)(pcVar9 + lVar12) = pppdVar17;
          *(int *)(pcVar9 + lVar12 + 8) = iVar7;
          uVar18 = uVar18 + 0x10;
        } while (local_128 != uVar18);
      }
      ptVar6 = local_118;
      lVar12 = *(long *)(*plVar8 + (long)orgpivot[(int)plVar8[1]] * 8);
      lVar16 = *(long *)(*plVar8 + (long)destpivot[(int)plVar8[1]] * 8);
      lVar13 = 0;
      do {
        local_c8[lVar13] =
             (*(double *)(lVar12 + lVar13 * 8) + *(double *)(lVar16 + lVar13 * 8)) * 0.5;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_108.min_max_dihedangle = 1;
      local_108.initval = local_d0 + 1.0;
      local_108.numofsearchdirs = 0x14;
      local_108.searchstep = 0.001;
      local_108.maxiter = 100;
      local_140.tet = pppdVar17;
      local_140.ver = iVar7;
      iVar7 = smoothpoint(local_118,local_c8,local_118->cavetetlist,1,&local_108);
      uVar14 = local_11c;
      if (iVar7 == 0) {
        ptVar6->cavetetlist->objects = 0;
      }
      else {
        if (local_108.smthiter == local_108.maxiter) {
          do {
            local_108.searchstep = local_108.searchstep * 10.0;
            local_108.initval = local_108.imprval;
            local_108.smthiter = 0;
            smoothpoint(ptVar6,local_c8,ptVar6->cavetetlist,1,&local_108);
          } while (local_108.smthiter == local_108.maxiter);
        }
        ptVar6->cavetetlist->objects = 0;
        if (iVar7 != 0) {
          makepoint(ptVar6,&local_110,FREEVOLVERTEX);
          local_110[2] = local_c8[2];
          *local_110 = local_c8[0];
          local_110[1] = local_c8[1];
          if (0 < (int)uVar14) {
            lVar12 = 0;
            do {
              puVar2 = (uint *)(*(long *)((long)plVar8 + lVar12) + (long)ptVar6->elemmarkerindex * 4
                               );
              *puVar2 = *puVar2 | 1;
              paVar4 = ptVar6->caveoldtetlist;
              pcVar9 = arraypool::getblock(paVar4,(int)paVar4->objects);
              lVar16 = (long)paVar4->objectbytes *
                       ((long)paVar4->objectsperblock - 1U & paVar4->objects);
              paVar4->objects = paVar4->objects + 1;
              *(undefined8 *)(pcVar9 + lVar16) = *(undefined8 *)((long)plVar8 + lVar12);
              *(undefined4 *)(pcVar9 + lVar16 + 8) = *(undefined4 *)((long)plVar8 + lVar12 + 8);
              lVar12 = lVar12 + 0x10;
            } while ((ulong)uVar14 << 4 != lVar12);
          }
          local_140.tet = (tetrahedron *)*plVar8;
          local_140.ver = (int)plVar8[1];
          if (ptVar6->b->metric != 0) {
            locate(ptVar6,local_110,&local_140,0);
          }
          operator_delete__(local_130);
          local_a8.iloc = 0xb;
          local_a8.chkencflag = local_120;
          local_a8.assignmeshsize = ptVar6->b->metric;
          iVar7 = insertpoint(ptVar6,local_110,&local_140,(face *)0x0,(face *)0x0,&local_a8);
          if (iVar7 == 0) {
            *(uint *)((long)local_110 + (long)ptVar6->pointmarkindex * 4 + 4) =
                 *(byte *)((long)local_110 + (long)ptVar6->pointmarkindex * 4 + 4) | 0xa00;
            pmVar5 = ptVar6->points;
            *local_110 = (double)pmVar5->deaditemstack;
            pmVar5->deaditemstack = local_110;
            pmVar5->items = pmVar5->items + -1;
            return 0;
          }
          ptVar6->st_volref_count = ptVar6->st_volref_count + 1;
          if (0 < ptVar6->steinerleft) {
            ptVar6->steinerleft = ptVar6->steinerleft + -1;
            return 1;
          }
          return 1;
        }
      }
      operator_delete__(plVar8);
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::splitsliver(triface *slitet, REAL cosd, int chkencflag)
{
  triface *abtets;
  triface searchtet, spintet, *parytet;
  point pa, pb, steinerpt;
  optparameters opm;
  insertvertexflags ivf;
  REAL smtpt[3], midpt[3];
  int success;
  int t1ver;
  int n, i;

  // 'slitet' is [c,d,a,b], where [c,d] has a big dihedral angle. 
  // Go to the opposite edge [a,b].
  edestoppo(*slitet, searchtet); // [a,b,c,d].

  // Do not split a segment.
  if (issubseg(searchtet)) {
    return 0; 
  }

  // Count the number of tets shared at [a,b].
  // Do not split it if it is a hull edge.
  spintet = searchtet;
  n = 0; 
  while (1) {
    if (ishulltet(spintet)) break;
    n++;
    fnextself(spintet);
    if (spintet.tet == searchtet.tet) break;
  }
  if (ishulltet(spintet)) {
    return 0; // It is a hull edge.
  }

  // Get all tets at edge [a,b].
  abtets = new triface[n];
  spintet = searchtet;
  for (i = 0; i < n; i++) {
    abtets[i] = spintet;
    fnextself(spintet);
  }

  // Initialize the list of 2n boundary faces.
  for (i = 0; i < n; i++) {    
    eprev(abtets[i], searchtet);
    esymself(searchtet); // [a,p_i,p_i+1].
    cavetetlist->newindex((void **) &parytet);
    *parytet = searchtet;
    enext(abtets[i], searchtet);
    esymself(searchtet); // [p_i,b,p_i+1].
    cavetetlist->newindex((void **) &parytet);
    *parytet = searchtet;
  }

  // Init the Steiner point at the midpoint of edge [a,b].
  pa = org(abtets[0]);
  pb = dest(abtets[0]);
  for (i = 0; i < 3; i++) {
    smtpt[i] = midpt[i] = 0.5 * (pa[i] + pb[i]);
  }

  // Point smooth options.
  opm.min_max_dihedangle = 1;
  opm.initval = cosd + 1.0; // Initial volume is zero.
  opm.numofsearchdirs = 20;
  opm.searchstep = 0.001;  
  opm.maxiter = 100; // Limit the maximum iterations.

  success = smoothpoint(smtpt, cavetetlist, 1, &opm);

  if (success) {
    while (opm.smthiter == opm.maxiter) {
      // It was relocated and the prescribed maximum iteration reached. 
      // Try to increase the search stepsize.
      opm.searchstep *= 10.0;
      //opm.maxiter = 100; // Limit the maximum iterations.
      opm.initval = opm.imprval;
      opm.smthiter = 0; // Init.
      smoothpoint(smtpt, cavetetlist, 1, &opm);  
    }
  } // if (success)

  cavetetlist->restart();

  if (!success) {
    delete [] abtets;
    return 0;
  }


  // Insert the Steiner point.
  makepoint(&steinerpt, FREEVOLVERTEX);
  for (i = 0; i < 3; i++) steinerpt[i] = smtpt[i];

  // Insert the created Steiner point.
  for (i = 0; i < n; i++) {
    infect(abtets[i]);
    caveoldtetlist->newindex((void **) &parytet);
    *parytet = abtets[i];
  }

  searchtet = abtets[0]; // No need point location.
  if (b->metric) {
    locate(steinerpt, &searchtet); // For size interpolation.
  }

  delete [] abtets;

  ivf.iloc = (int) INSTAR;
  ivf.chkencflag = chkencflag;
  ivf.assignmeshsize = b->metric; 


  if (insertpoint(steinerpt, &searchtet, NULL, NULL, &ivf)) {
    // The vertex has been inserted.
    st_volref_count++; 
    if (steinerleft > 0) steinerleft--;
    return 1;
  } else {
    // The Steiner point is too close to an existing vertex. Reject it.
    pointdealloc(steinerpt);
    return 0;
  }
}